

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_load_save.cpp
# Opt level: O0

bool Am_Load_Save_Context::Test(Am_Wrapper *in_data)

{
  Am_ID_Tag AVar1;
  uint uVar2;
  bool local_11;
  Am_Wrapper *in_data_local;
  
  local_11 = false;
  if (in_data != (Am_Wrapper *)0x0) {
    uVar2 = (**(in_data->super_Am_Registered_Type)._vptr_Am_Registered_Type)();
    AVar1 = Am_Load_Save_Context_Data::Am_Load_Save_Context_Data_ID();
    local_11 = (uVar2 & 0xffff) == (uint)AVar1;
  }
  return local_11;
}

Assistant:

void
Am_Load_Save_Context::Register_Prototype(const char *name, Am_Wrapper *value)
{
  if (!data) {
    data = new Am_Load_Save_Context_Data();
  }

  data = static_cast<Am_Load_Save_Context_Data *>(data->Make_Unique());

  Wrapper_Holder holder(value);

  data->names->SetAt(holder, Name_Num(name));
  data->prototypes->SetAt(Name_Num(name), holder);
}